

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O3

void emitter_print_value(emitter_t *emitter,emitter_justify_t justify,int width,
                        emitter_type_t value_type,void *value)

{
  char fmt [10];
  char buf [256];
  
  (*(code *)(&DAT_0014f3c4 + *(int *)(&DAT_0014f3c4 + (ulong)value_type * 4)))();
  return;
}

Assistant:

static inline void
emitter_print_value(emitter_t *emitter, emitter_justify_t justify, int width,
    emitter_type_t value_type, const void *value) {
	size_t str_written;
#define BUF_SIZE 256
#define FMT_SIZE 10
	/*
	 * We dynamically generate a format string to emit, to let us use the
	 * snprintf machinery.  This is kinda hacky, but gets the job done
	 * quickly without having to think about the various snprintf edge
	 * cases.
	 */
	char fmt[FMT_SIZE];
	char buf[BUF_SIZE];

#define EMIT_SIMPLE(type, format)					\
	emitter_printf(emitter,						\
	    emitter_gen_fmt(fmt, FMT_SIZE, format, justify, width),	\
	    *(const type *)value);

	switch (value_type) {
	case emitter_type_bool:
		emitter_printf(emitter, 
		    emitter_gen_fmt(fmt, FMT_SIZE, "%s", justify, width),
		    *(const bool *)value ?  "true" : "false");
		break;
	case emitter_type_int:
		EMIT_SIMPLE(int, "%d")
		break;
	case emitter_type_unsigned:
		EMIT_SIMPLE(unsigned, "%u")
		break;
	case emitter_type_ssize:
		EMIT_SIMPLE(ssize_t, "%zd")
		break;
	case emitter_type_size:
		EMIT_SIMPLE(size_t, "%zu")
		break;
	case emitter_type_string:
		str_written = malloc_snprintf(buf, BUF_SIZE, "\"%s\"",
		    *(const char *const *)value);
		/*
		 * We control the strings we output; we shouldn't get anything
		 * anywhere near the fmt size.
		 */
		assert(str_written < BUF_SIZE);
		emitter_printf(emitter, 
		    emitter_gen_fmt(fmt, FMT_SIZE, "%s", justify, width), buf);
		break;
	case emitter_type_uint32:
		EMIT_SIMPLE(uint32_t, "%" FMTu32)
		break;
	case emitter_type_uint64:
		EMIT_SIMPLE(uint64_t, "%" FMTu64)
		break;
	case emitter_type_title:
		EMIT_SIMPLE(char *const, "%s");
		break;
	default:
		unreachable();
	}
#undef BUF_SIZE
#undef FMT_SIZE
}